

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorStatus.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorStatus::SetIFFMission(Mode5InterrogatorStatus *this,KUINT8 IFFM)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KUINT8 local_11;
  Mode5InterrogatorStatus *pMStack_10;
  KUINT8 IFFM_local;
  Mode5InterrogatorStatus *this_local;
  
  if (7 < IFFM) {
    local_11 = IFFM;
    pMStack_10 = this;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SetIFFMission",&local_39);
    KException::KException(this_00,&local_38,8);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0xf8 | IFFM & 7;
  return;
}

Assistant:

void Mode5InterrogatorStatus::SetIFFMission(KUINT8 IFFM) noexcept(false)
{
	if( IFFM > 7 )throw KException( __FUNCTION__, INVALID_DATA );
	m_StatusUnion.m_ui8IffMis = IFFM;
}